

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

FlagValue * __thiscall gflags::anon_unknown_2::FlagValue::New(FlagValue *this)

{
  bool *valbuf;
  int *valbuf_00;
  uint *valbuf_01;
  long *valbuf_02;
  unsigned_long *valbuf_03;
  double *valbuf_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *valbuf_05;
  FlagValue *this_local;
  
  switch(this->type_) {
  case '\0':
    this_local = (FlagValue *)operator_new(0x10);
    valbuf = (bool *)operator_new(1);
    *valbuf = false;
    FlagValue<bool>(this_local,valbuf,true);
    break;
  case '\x01':
    this_local = (FlagValue *)operator_new(0x10);
    valbuf_00 = (int *)operator_new(4);
    *valbuf_00 = 0;
    FlagValue<int>(this_local,valbuf_00,true);
    break;
  case '\x02':
    this_local = (FlagValue *)operator_new(0x10);
    valbuf_01 = (uint *)operator_new(4);
    *valbuf_01 = 0;
    FlagValue<unsigned_int>(this_local,valbuf_01,true);
    break;
  case '\x03':
    this_local = (FlagValue *)operator_new(0x10);
    valbuf_02 = (long *)operator_new(8);
    *valbuf_02 = 0;
    FlagValue<long>(this_local,valbuf_02,true);
    break;
  case '\x04':
    this_local = (FlagValue *)operator_new(0x10);
    valbuf_03 = (unsigned_long *)operator_new(8);
    *valbuf_03 = 0;
    FlagValue<unsigned_long>(this_local,valbuf_03,true);
    break;
  case '\x05':
    this_local = (FlagValue *)operator_new(0x10);
    valbuf_04 = (double *)operator_new(8);
    *valbuf_04 = 0.0;
    FlagValue<double>(this_local,valbuf_04,true);
    break;
  case '\x06':
    this_local = (FlagValue *)operator_new(0x10);
    valbuf_05 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                operator_new(0x20);
    std::__cxx11::string::string((string *)valbuf_05);
    (anonymous_namespace)::FlagValue::FlagValue<std::__cxx11::string>
              ((FlagValue *)this_local,valbuf_05,true);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                  ,0x1d5,"FlagValue *gflags::(anonymous namespace)::FlagValue::New() const");
  }
  return this_local;
}

Assistant:

FlagValue* FlagValue::New() const {
  switch (type_) {
    case FV_BOOL:   return new FlagValue(new bool(false), true);
    case FV_INT32:  return new FlagValue(new int32(0), true);
    case FV_UINT32: return new FlagValue(new uint32(0), true);
    case FV_INT64:  return new FlagValue(new int64(0), true);
    case FV_UINT64: return new FlagValue(new uint64(0), true);
    case FV_DOUBLE: return new FlagValue(new double(0.0), true);
    case FV_STRING: return new FlagValue(new string, true);
    default: assert(false); return NULL;  // unknown type
  }
}